

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
just::test::assertion_failed::assertion_failed
          (assertion_failed *this,string *msg_,string *filename_,int line_)

{
  int line__local;
  string *filename__local;
  string *msg__local;
  assertion_failed *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)msg_);
  std::__cxx11::string::string((string *)&this->_filename,(string *)filename_);
  this->_line = line_;
  return;
}

Assistant:

assertion_failed(
        const std::string& msg_,
        const std::string& filename_,
        int line_
      ) :
        _msg(msg_),
        _filename(filename_),
        _line(line_)
      {}